

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midiclock.cpp
# Opt level: O1

int main(int param_1,char **argv)

{
  long lVar1;
  ostream *poVar2;
  string prog;
  allocator<char> local_29;
  long *local_28;
  long local_20;
  long local_18 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,*argv,&local_29);
  lVar1 = std::__cxx11::string::find((char *)&local_28,0x104129,0);
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find((char *)&local_28,0x104136,0);
    if (lVar1 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Don\'t know what to do as ",0x19);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_28,local_20);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    else {
      clock_out();
    }
  }
  else {
    clock_in();
  }
  if (local_28 != local_18) {
    operator_delete(local_28,local_18[0] + 1);
  }
  return 0;
}

Assistant:

int main( int, const char *argv[] )
{
  std::string prog(argv[0]);
  if (prog.find("midiclock_in") != prog.npos) {
    clock_in();
  }
  else if (prog.find("midiclock_out") != prog.npos) {
    clock_out();
  }
  else {
    std::cout << "Don't know what to do as " << prog << std::endl;
  }
  return 0;
}